

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O0

Vec_Int_t * Saig_MvManFindOscilators(Saig_MvMan_t *p,Vec_Int_t **pvConst0)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int local_30;
  int i;
  int Entry;
  Vec_Int_t *vOscils;
  Vec_Int_t *vBinary;
  Vec_Int_t **pvConst0_local;
  Saig_MvMan_t *p_local;
  
  vBinary = (Vec_Int_t *)pvConst0;
  pvConst0_local = (Vec_Int_t **)p;
  pVVar3 = Saig_MvManFindConstBinaryFlops(p,&vOscils);
  *(Vec_Int_t **)vBinary = pVVar3;
  pVVar3 = Vec_IntAlloc(100);
  for (local_30 = 0; iVar1 = Vec_IntSize(vOscils), local_30 < iVar1; local_30 = local_30 + 1) {
    iVar1 = Vec_IntEntry(vOscils,local_30);
    iVar2 = Saig_MvManCheckOscilator((Saig_MvMan_t *)pvConst0_local,iVar1);
    if (iVar2 != 0) {
      Vec_IntPush(pVVar3,iVar1);
    }
  }
  Vec_IntFree(vOscils);
  return pVVar3;
}

Assistant:

Vec_Int_t * Saig_MvManFindOscilators( Saig_MvMan_t * p, Vec_Int_t ** pvConst0 )
{
    Vec_Int_t * vBinary, * vOscils;
    int Entry, i;
    // detect constant flops
    *pvConst0 = Saig_MvManFindConstBinaryFlops( p, &vBinary );
    // check binary flops
    vOscils = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vBinary, Entry, i )
        if ( Saig_MvManCheckOscilator( p, Entry ) )
            Vec_IntPush( vOscils, Entry );
    Vec_IntFree( vBinary );
    return vOscils;
}